

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

void HighsHashTree<int,int>::mergeIntoLeaf<1,3>
               (InnerLeaf<1> *leaf,InnerLeaf<3> *mergeLeaf,int hashPos)

{
  Entry *entry;
  int i;
  long lVar1;
  
  entry = (mergeLeaf->entries)._M_elems;
  for (lVar1 = 0; lVar1 < mergeLeaf->size; lVar1 = lVar1 + 1) {
    HighsHashTree<int,_int>::InnerLeaf<1>::insert_entry
              (leaf,(ulong)(uint)entry->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                    (ulong)(uint)entry->key_ * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,hashPos,
               entry);
    entry = entry + 1;
  }
  return;
}

Assistant:

static void mergeIntoLeaf(InnerLeaf<SizeClass1>* leaf,
                            InnerLeaf<SizeClass2>* mergeLeaf, int hashPos) {
    for (int i = 0; i < mergeLeaf->size; ++i)
      leaf->insert_entry(compute_hash(mergeLeaf->entries[i].key()), hashPos,
                         mergeLeaf->entries[i]);
  }